

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O3

ARKodeSPRKTable arkodeSymplecticMcLachlan5(void)

{
  sunrealtype *psVar1;
  ARKodeSPRKTable pAVar2;
  
  pAVar2 = ARKodeSPRKTable_Alloc(6);
  if (pAVar2 != (ARKodeSPRKTable)0x0) {
    pAVar2->q = 5;
    pAVar2->stages = 6;
    psVar1 = pAVar2->a;
    *psVar1 = 0.33983962583911;
    psVar1[1] = -0.08860133690302732;
    psVar1[2] = 0.5858564768259621;
    psVar1[3] = -0.6030393565364919;
    psVar1[4] = 0.3235807965546976;
    psVar1[5] = 0.4423637942197495;
    psVar1 = pAVar2->ahat;
    *psVar1 = 0.11939002928756727;
    psVar1[1] = 0.6989273703824752;
    psVar1[2] = -0.17131235827160077;
    psVar1[3] = 0.40126950225135344;
    psVar1[4] = 0.010705081848235983;
    psVar1[5] = -0.058979625498031166;
  }
  return pAVar2;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticMcLachlan5(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(6);
  if (!sprk_table) { return NULL; }
  sprk_table->q       = 5;
  sprk_table->stages  = 6;
  sprk_table->a[0]    = SUN_RCONST(0.339839625839110000);
  sprk_table->a[1]    = -SUN_RCONST(0.088601336903027329);
  sprk_table->a[2]    = SUN_RCONST(0.5858564768259621188);
  sprk_table->a[3]    = -SUN_RCONST(0.603039356536491888);
  sprk_table->a[4]    = SUN_RCONST(0.3235807965546976394);
  sprk_table->a[5]    = SUN_RCONST(0.4423637942197494587);
  sprk_table->ahat[0] = SUN_RCONST(0.1193900292875672758);
  sprk_table->ahat[1] = SUN_RCONST(0.6989273703824752308);
  sprk_table->ahat[2] = -SUN_RCONST(0.1713123582716007754);
  sprk_table->ahat[3] = SUN_RCONST(0.4012695022513534480);
  sprk_table->ahat[4] = SUN_RCONST(0.0107050818482359840);
  sprk_table->ahat[5] = -SUN_RCONST(0.0589796254980311632);
  return sprk_table;
}